

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLOutput.cpp
# Opt level: O0

void __thiscall
Test::HTMLOutput::generateSuitesTable(HTMLOutput *this,ostream *stream,bool includePassed)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pSVar4;
  rep rVar5;
  double dVar6;
  string local_50;
  __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
  local_30;
  __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
  local_28;
  iterator info;
  bool includePassed_local;
  ostream *stream_local;
  HTMLOutput *this_local;
  
  info._M_current._7_1_ = includePassed;
  poVar3 = std::operator<<(stream,
                           "<table id=\'top\' class=\'suites\'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
                          );
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_28._M_current =
       (SuiteInfo *)
       std::
       vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>::
       begin((vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
              *)(this + 8));
  do {
    local_30._M_current =
         (SuiteInfo *)
         std::
         vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
         ::end((vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>
                *)(this + 8));
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) {
      poVar3 = std::operator<<(stream,"</table>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return;
    }
    if ((info._M_current._7_1_ & 1) == 0) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      uVar1 = pSVar4->numPositiveTests;
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      if (uVar1 != pSVar4->numTests) goto LAB_001640e6;
    }
    else {
LAB_001640e6:
      poVar3 = std::operator<<(stream,"<tr><td><a href=\'#suite_");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      poVar3 = std::operator<<(poVar3,(string *)pSVar4);
      poVar3 = std::operator<<(poVar3,"\'>");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      poVar3 = std::operator<<(poVar3,(string *)pSVar4);
      poVar3 = std::operator<<(poVar3,"</a></td>");
      poVar3 = std::operator<<(poVar3,"<td>");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pSVar4->numTests);
      poVar3 = std::operator<<(poVar3,"</td>");
      poVar3 = std::operator<<(poVar3,"<td class=\'");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      uVar1 = pSVar4->numTests;
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      getCssClass_abi_cxx11_(&local_50,(ulong)uVar1,(ulong)pSVar4->numPositiveTests);
      poVar3 = std::operator<<(poVar3,(string *)&local_50);
      poVar3 = std::operator<<(poVar3,"\'>");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pSVar4->numPositiveTests);
      poVar3 = std::operator<<(poVar3," (");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      uVar1 = pSVar4->numPositiveTests;
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      dVar6 = Output::prettifyPercentage((Output *)this,(double)uVar1,(double)pSVar4->numTests);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
      poVar3 = std::operator<<(poVar3,"%)</td>");
      poVar3 = std::operator<<(poVar3,"<td>");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&pSVar4->suiteDuration);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)rVar5 / 1000.0);
      poVar3 = std::operator<<(poVar3," ms (");
      pSVar4 = __gnu_cxx::
               __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
               ::operator->(&local_28);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&pSVar4->suiteDuration);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)rVar5 / 1000000.0);
      poVar3 = std::operator<<(poVar3," s)</td>");
      poVar3 = std::operator<<(poVar3,"</tr>");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_50);
    }
    __gnu_cxx::
    __normal_iterator<Test::CollectorOutput::SuiteInfo_*,_std::vector<Test::CollectorOutput::SuiteInfo,_std::allocator<Test::CollectorOutput::SuiteInfo>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

void HTMLOutput::generateSuitesTable(std::ostream &stream, bool includePassed) {
  // header
  stream
      << "<table id='top' class='suites'><tr><th>Suite</th><th># Tests</th><th>Passed Tests</th><th>Duration</th></tr>"
      << std::endl;
  // content
  auto info = suites.begin();
  while (info != suites.end()) {
    if (includePassed || info->numPositiveTests != info->numTests) {
      stream << "<tr><td><a href='#suite_" << info->suiteName << "'>" << info->suiteName << "</a></td>"
             << "<td>" << info->numTests << "</td>"
             << "<td class='" << getCssClass(info->numTests, info->numPositiveTests) << "'>" << info->numPositiveTests
             << " (" << prettifyPercentage(info->numPositiveTests, info->numTests) << "%)</td>"
             << "<td>" << static_cast<double>(info->suiteDuration.count()) / 1000.0 << " ms ("
             << static_cast<double>(info->suiteDuration.count()) / 1000000.0 << " s)</td>"
             << "</tr>" << std::endl;
    }
    ++info;
  }
  stream << "</table>" << std::endl;
}